

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.h
# Opt level: O3

void __thiscall ser::MetainfoSet::ExtractValue<float>(MetainfoSet *this,string *key,float *value)

{
  const_iterator cVar1;
  float *pfVar2;
  long *plVar3;
  SerializationException *this_00;
  string msg;
  SerializationException exception;
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  undefined1 local_188 [360];
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                  *)this,key);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
    pfVar2 = boost::any_cast<float_const&>((any *)(cVar1._M_node + 2));
    *value = *pfVar2;
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 "Error: metainfo with key = ",key);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_198);
  *plVar3 = (long)(plVar3 + 2);
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_198 != (undefined1  [8])local_188) {
    operator_delete((void *)local_198);
  }
  local_198 = (undefined1  [8])&PTR__SerializationException_0018ea30;
  local_190._M_p = local_188 + 8;
  local_188._0_8_ = 0;
  local_188[8] = '\0';
  std::__cxx11::string::_M_assign((string *)&local_190);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)local_198);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

inline void ExtractValue(const std::string& key, ValueType& value) const
        {
            std::map<std::string, boost::any>::const_iterator iter = data_.find(key);

            // Check that type exists
            if (iter == data_.end())
            {
                std::string msg = "Error: metainfo with key = " + key + " does not exist in set\n";
                SerializationException exception;
                exception.Init(msg);
                throw exception;
            }

            // Check type
            try
            {
                const boost::any& anyvalue = iter->second;
                value = boost::any_cast<ValueType>(anyvalue);
            }
            catch(boost::bad_any_cast&)
            {
                std::ostringstream msg;
                msg << "Error: type mismatch with metainfo " << key << "\n";
                msg << "Stored metainfo has type " << iter->second.type().name() << "\n";
                msg << "Provided reference has type " << typeid(ValueType).name() << "\n";
                SerializationException exception;
                exception.Init(msg.str());
                throw exception;
            }
        }